

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall GameBoard::play(GameBoard *this,Value *input)

{
  ArrayIndex AVar1;
  Int IVar2;
  Int IVar3;
  Int y_00;
  Int x_00;
  Int o_00;
  GameBoard *this_00;
  GameBoard *in_RDI;
  Tetris enemyBlock;
  Value *myInput;
  Tetris myBlock;
  Value *myOutput;
  int o;
  int y;
  int x;
  int currTypeForColor [2];
  int i;
  Value *first;
  int blockType;
  int nextTypeForColor [2];
  Tetris *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  Value *in_stack_ffffffffffffff80;
  Value *in_stack_ffffffffffffff98;
  Int in_stack_ffffffffffffffc0;
  ArrayIndex in_stack_ffffffffffffffc4;
  Int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_2c;
  Int local_18 [6];
  
  Json::Value::operator[]
            ((Value *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  AVar1 = Json::Value::size((Value *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  in_RDI->turnID = AVar1 + 1;
  Json::Value::operator[]
            ((Value *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  Json::Value::operator[]
            ((Value *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             in_stack_ffffffffffffffc4);
  Json::Value::operator[]
            ((Value *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  IVar2 = Json::Value::asInt(in_stack_ffffffffffffff98);
  Json::Value::operator[]
            ((Value *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  IVar3 = Json::Value::asInt(in_stack_ffffffffffffff98);
  in_RDI->currBotColor = IVar3;
  in_RDI->enemyColor = 1 - in_RDI->currBotColor;
  local_18[0] = IVar2;
  local_18[1] = IVar2;
  in_RDI->typeCountForColor[0][IVar2] = in_RDI->typeCountForColor[0][IVar2] + 1;
  in_RDI->typeCountForColor[1][IVar2] = in_RDI->typeCountForColor[1][IVar2] + 1;
  for (local_2c = 1; local_2c < in_RDI->turnID; local_2c = local_2c + 1) {
    IVar2 = local_18[0];
    Json::Value::operator[]
              ((Value *)CONCAT44(local_18[0],in_stack_ffffffffffffffc8),
               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    Json::Value::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    Json::Value::operator[]
              ((Value *)CONCAT44(IVar2,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    IVar3 = Json::Value::asInt(in_stack_ffffffffffffff98);
    Json::Value::operator[]
              ((Value *)CONCAT44(IVar2,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    y_00 = Json::Value::asInt(in_stack_ffffffffffffff98);
    Json::Value::operator[]
              ((Value *)CONCAT44(IVar2,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(y_00,in_stack_ffffffffffffffc0));
    x_00 = Json::Value::asInt(in_stack_ffffffffffffff98);
    Json::Value::operator[]
              ((Value *)CONCAT44(IVar2,x_00),(char *)CONCAT44(y_00,in_stack_ffffffffffffffc0));
    o_00 = Json::Value::asInt(in_stack_ffffffffffffff98);
    Tetris::Tetris((Tetris *)&stack0xffffffffffffff90,in_RDI,
                   *(int *)(&stack0xffffffffffffffcc + (long)in_RDI->currBotColor * 4),
                   in_RDI->currBotColor);
    Tetris::set((Tetris *)&stack0xffffffffffffff90,x_00,y_00,o_00);
    Tetris::place(in_stack_ffffffffffffff68);
    in_RDI->typeCountForColor[in_RDI->enemyColor][IVar3] =
         in_RDI->typeCountForColor[in_RDI->enemyColor][IVar3] + 1;
    local_18[in_RDI->enemyColor] = IVar3;
    Json::Value::operator[]((Value *)CONCAT44(IVar2,x_00),(char *)CONCAT44(y_00,o_00));
    this_00 = (GameBoard *)
              Json::Value::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    Json::Value::operator[]((Value *)CONCAT44(IVar2,x_00),(char *)CONCAT44(y_00,o_00));
    IVar3 = Json::Value::asInt(in_stack_ffffffffffffff98);
    Json::Value::operator[]((Value *)CONCAT44(IVar2,x_00),(char *)CONCAT44(y_00,o_00));
    in_stack_ffffffffffffffc4 = Json::Value::asInt(in_stack_ffffffffffffff98);
    Json::Value::operator[]
              ((Value *)CONCAT44(IVar2,x_00),(char *)CONCAT44(in_stack_ffffffffffffffc4,o_00));
    in_stack_ffffffffffffffc8 = Json::Value::asInt(in_stack_ffffffffffffff98);
    Json::Value::operator[]
              ((Value *)CONCAT44(IVar2,in_stack_ffffffffffffffc8),
               (char *)CONCAT44(in_stack_ffffffffffffffc4,o_00));
    in_stack_ffffffffffffffc0 = Json::Value::asInt(in_stack_ffffffffffffff98);
    Tetris::Tetris((Tetris *)&stack0xffffffffffffff60,in_RDI,
                   *(int *)(&stack0xffffffffffffffcc + (long)in_RDI->enemyColor * 4),
                   in_RDI->enemyColor);
    Tetris::set((Tetris *)&stack0xffffffffffffff60,in_stack_ffffffffffffffc8,
                in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
    Tetris::place(in_stack_ffffffffffffff68);
    in_RDI->typeCountForColor[in_RDI->currBotColor][IVar3] =
         in_RDI->typeCountForColor[in_RDI->currBotColor][IVar3] + 1;
    local_18[in_RDI->currBotColor] = IVar3;
    eliminate(in_RDI,0);
    eliminate(in_RDI,1);
    transfer(this_00);
  }
  in_RDI->currBlockType = local_18[in_RDI->currBotColor];
  in_RDI->enemyType = local_18[in_RDI->enemyColor];
  return;
}

Assistant:

void GameBoard::play(const Json::Value &input)
{
    int nextTypeForColor[2];
    int blockType;

    // 先读入第一回合，得到自己的颜色
    // 双方的第一块肯定是一样的
    turnID = input["responses"].size() + 1;
    auto &first = input["requests"][(Json::UInt) 0];

    blockType = first["block"].asInt();
    currBotColor = first["color"].asInt();

    enemyColor = 1 - currBotColor;
    nextTypeForColor[0] = blockType;
    nextTypeForColor[1] = blockType;
    typeCountForColor[0][blockType]++;
    typeCountForColor[1][blockType]++;


    // 然后分析以前每回合的输入输出，并恢复状态
    // 循环中，color 表示当前这一行是 color 的行为
    // 平台保证所有输入都是合法输入
    for (int i = 1; i < turnID; i++) {
        int currTypeForColor[2] = { nextTypeForColor[0], nextTypeForColor[1] };
        int x, y, o;
        // 根据这些输入输出逐渐恢复状态到当前回合

        // 先读自己的输出，也就是自己的行为
        // 自己的输出是一个序列，但是只有最后一步有用
        // 所以只保留最后一步
        // 然后模拟最后一步放置块
        auto &myOutput = input["responses"][i - 1];
        blockType = myOutput["block"].asInt();
        y = myOutput["x"].asInt();
        x = myOutput["y"].asInt();
        o = myOutput["o"].asInt();

        // 我当时把上一块落到了 x y o！
        Tetris myBlock(this, currTypeForColor[currBotColor], currBotColor);
        myBlock.set(x, y, o).place();

        // 我给对方什么块来着？
        typeCountForColor[enemyColor][blockType]++;
        nextTypeForColor[enemyColor] = blockType;

        // 然后读自己的输入，也就是对方的行为
        // 裁判给自己的输入是对方的最后一步
        auto &myInput = input["requests"][i];
        blockType = myInput["block"].asInt();
        y = myInput["x"].asInt();
        x = myInput["y"].asInt();
        o = myInput["o"].asInt();

        // 对方当时把上一块落到了 x y o！
        Tetris enemyBlock(this, currTypeForColor[enemyColor], enemyColor);
        enemyBlock.set(x, y, o).place();

        // 对方给我什么块来着？
        typeCountForColor[currBotColor][blockType]++;
        nextTypeForColor[currBotColor] = blockType;

        // 检查消去
        eliminate(0);
        eliminate(1);

        // 进行转移
        transfer();
    }
    currBlockType = nextTypeForColor[currBotColor];
    enemyType = nextTypeForColor[enemyColor];
}